

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O1

void __thiscall duckdb::DuckIndexScanState::~DuckIndexScanState(DuckIndexScanState *this)

{
  pointer plVar1;
  pointer puVar2;
  
  (this->super_TableScanGlobalState).super_GlobalTableFunctionState._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckIndexScanState_019b47c0;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            (&(this->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  plVar1 = (this->row_ids).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
  }
  (this->super_TableScanGlobalState).super_GlobalTableFunctionState._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__TableScanGlobalState_019b4740;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&(this->super_TableScanGlobalState).scanned_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  puVar2 = (this->super_TableScanGlobalState).projection_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  GlobalTableFunctionState::~GlobalTableFunctionState((GlobalTableFunctionState *)this);
  operator_delete(this);
  return;
}

Assistant:

DuckIndexScanState(ClientContext &context, const FunctionData *bind_data_p)
	    : TableScanGlobalState(context, bind_data_p), next_batch_index(0), finished(false) {
	}